

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcBarBuf.c
# Opt level: O0

Vec_Ptr_t * Abc_NtkToBarBufsCollect(Abc_Ntk_t *pNtk)

{
  int iVar1;
  int iVar2;
  Vec_Ptr_t *p;
  Abc_Obj_t *pAVar3;
  Abc_Obj_t *pAVar4;
  int local_24;
  int i;
  Abc_Obj_t *pObj;
  Vec_Ptr_t *vNodes;
  Abc_Ntk_t *pNtk_local;
  
  iVar1 = Abc_NtkIsLogic(pNtk);
  if (iVar1 == 0) {
    __assert_fail("Abc_NtkIsLogic(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcBarBuf.c"
                  ,0x165,"Vec_Ptr_t *Abc_NtkToBarBufsCollect(Abc_Ntk_t *)");
  }
  if (pNtk->nBarBufs < 1) {
    __assert_fail("pNtk->nBarBufs > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcBarBuf.c"
                  ,0x166,"Vec_Ptr_t *Abc_NtkToBarBufsCollect(Abc_Ntk_t *)");
  }
  iVar1 = pNtk->nBarBufs;
  iVar2 = Abc_NtkLatchNum(pNtk);
  if (iVar1 != iVar2) {
    __assert_fail("pNtk->nBarBufs == Abc_NtkLatchNum(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcBarBuf.c"
                  ,0x167,"Vec_Ptr_t *Abc_NtkToBarBufsCollect(Abc_Ntk_t *)");
  }
  iVar1 = Abc_NtkObjNum(pNtk);
  p = Vec_PtrAlloc(iVar1);
  Abc_NtkIncrementTravId(pNtk);
  for (local_24 = 0; iVar1 = Abc_NtkCiNum(pNtk), local_24 < iVar1; local_24 = local_24 + 1) {
    pAVar3 = Abc_NtkCi(pNtk,local_24);
    iVar1 = Abc_NtkCiNum(pNtk);
    if (iVar1 - pNtk->nBarBufs <= local_24) break;
    Vec_PtrPush(p,pAVar3);
    Abc_NodeSetTravIdCurrent(pAVar3);
  }
  for (local_24 = 0; iVar1 = Abc_NtkCoNum(pNtk), local_24 < iVar1; local_24 = local_24 + 1) {
    pAVar3 = Abc_NtkCo(pNtk,local_24);
    iVar1 = Abc_NtkCoNum(pNtk);
    if (iVar1 - pNtk->nBarBufs <= local_24) {
      pAVar4 = Abc_ObjFanin0(pAVar3);
      Abc_NtkToBarBufsCollect_rec(pAVar4,p);
      Vec_PtrPush(p,pAVar3);
      pAVar4 = Abc_ObjFanout0(pAVar3);
      Vec_PtrPush(p,pAVar4);
      pAVar4 = Abc_ObjFanout0(pAVar3);
      pAVar4 = Abc_ObjFanout0(pAVar4);
      Vec_PtrPush(p,pAVar4);
      Abc_NodeSetTravIdCurrent(pAVar3);
      pAVar4 = Abc_ObjFanout0(pAVar3);
      Abc_NodeSetTravIdCurrent(pAVar4);
      pAVar3 = Abc_ObjFanout0(pAVar3);
      pAVar3 = Abc_ObjFanout0(pAVar3);
      Abc_NodeSetTravIdCurrent(pAVar3);
    }
  }
  for (local_24 = 0; iVar1 = Abc_NtkCoNum(pNtk), local_24 < iVar1; local_24 = local_24 + 1) {
    pAVar3 = Abc_NtkCo(pNtk,local_24);
    iVar1 = Abc_NtkCoNum(pNtk);
    if (iVar1 - pNtk->nBarBufs <= local_24) break;
    pAVar4 = Abc_ObjFanin0(pAVar3);
    Abc_NtkToBarBufsCollect_rec(pAVar4,p);
    Vec_PtrPush(p,pAVar3);
    Abc_NodeSetTravIdCurrent(pAVar3);
  }
  iVar1 = Vec_PtrSize(p);
  iVar2 = Abc_NtkObjNum(pNtk);
  if (iVar1 == iVar2) {
    return p;
  }
  __assert_fail("Vec_PtrSize(vNodes) == Abc_NtkObjNum(pNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcBarBuf.c"
                ,0x185,"Vec_Ptr_t *Abc_NtkToBarBufsCollect(Abc_Ntk_t *)");
}

Assistant:

Vec_Ptr_t * Abc_NtkToBarBufsCollect( Abc_Ntk_t * pNtk )
{
    Vec_Ptr_t * vNodes;
    Abc_Obj_t * pObj;
    int i;
    assert( Abc_NtkIsLogic(pNtk) );
    assert( pNtk->nBarBufs > 0 );
    assert( pNtk->nBarBufs == Abc_NtkLatchNum(pNtk) );
    vNodes = Vec_PtrAlloc( Abc_NtkObjNum(pNtk) );
    Abc_NtkIncrementTravId( pNtk );
    Abc_NtkForEachCi( pNtk, pObj, i )
    {
        if ( i >= Abc_NtkCiNum(pNtk) - pNtk->nBarBufs )
            break;
        Vec_PtrPush( vNodes, pObj );
        Abc_NodeSetTravIdCurrent( pObj );
    }
    Abc_NtkForEachCo( pNtk, pObj, i )
    {
        if ( i < Abc_NtkCoNum(pNtk) - pNtk->nBarBufs )
            continue;
        Abc_NtkToBarBufsCollect_rec( Abc_ObjFanin0(pObj), vNodes );
        Vec_PtrPush( vNodes, pObj );
        Vec_PtrPush( vNodes, Abc_ObjFanout0(pObj) );
        Vec_PtrPush( vNodes, Abc_ObjFanout0(Abc_ObjFanout0(pObj)) );
        Abc_NodeSetTravIdCurrent( pObj );
        Abc_NodeSetTravIdCurrent( Abc_ObjFanout0(pObj) );
        Abc_NodeSetTravIdCurrent( Abc_ObjFanout0(Abc_ObjFanout0(pObj)) );
    }
    Abc_NtkForEachCo( pNtk, pObj, i )
    {
        if ( i >= Abc_NtkCoNum(pNtk) - pNtk->nBarBufs )
            break;
        Abc_NtkToBarBufsCollect_rec( Abc_ObjFanin0(pObj), vNodes );
        Vec_PtrPush( vNodes, pObj );
        Abc_NodeSetTravIdCurrent( pObj );
    }
    assert( Vec_PtrSize(vNodes) == Abc_NtkObjNum(pNtk) );
    return vNodes;
}